

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

HeapType __thiscall wasm::Type::getHeapType(Type *this)

{
  bool bVar1;
  TypeInfo *pTVar2;
  TypeInfo *info;
  Type *this_local;
  
  bVar1 = isBasic(this);
  if (bVar1) {
    getBasic(this);
    handle_unreachable("Unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x45d);
  }
  pTVar2 = anon_unknown_0::getTypeInfo((Type)this->id);
  if ((pTVar2->kind != TupleKind) && (pTVar2->kind == RefKind)) {
    return (HeapType)
           (uintptr_t)
           (pTVar2->field_2).tuple.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  handle_unreachable("Unexpected type",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x466);
}

Assistant:

HeapType Type::getHeapType() const {
  if (isBasic()) {
    switch (getBasic()) {
      case Type::none:
      case Type::unreachable:
      case Type::i32:
      case Type::i64:
      case Type::f32:
      case Type::f64:
      case Type::v128:
        break;
    }
    WASM_UNREACHABLE("Unexpected type");
  } else {
    auto* info = getTypeInfo(*this);
    switch (info->kind) {
      case TypeInfo::TupleKind:
        break;
      case TypeInfo::RefKind:
        return info->ref.heapType;
    }
    WASM_UNREACHABLE("Unexpected type");
  }
}